

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# external_signer.cpp
# Opt level: O0

bool ExternalSigner::Enumerate
               (string *command,vector<ExternalSigner,_std::allocator<ExternalSigner>_> *signers,
               string *chain)

{
  string_view key;
  string_view key_00;
  string_view key_01;
  bool bVar1;
  bool bVar2;
  runtime_error *prVar3;
  reference this;
  string *in_RDX;
  long in_FS_OFFSET;
  UniValue *model_field;
  ExternalSigner *signer_1;
  vector<ExternalSigner,_std::allocator<ExternalSigner>_> *__range2;
  bool duplicate;
  string *fingerprintStr;
  UniValue *fingerprint;
  UniValue *error;
  UniValue *signer;
  vector<UniValue,_std::allocator<UniValue>_> *__range1;
  iterator __end2;
  iterator __begin2;
  const_iterator __end1;
  const_iterator __begin1;
  string name;
  UniValue result;
  UniValue *in_stack_fffffffffffffd18;
  UniValue *in_stack_fffffffffffffd20;
  string *in_stack_fffffffffffffd28;
  undefined7 in_stack_fffffffffffffd30;
  undefined1 in_stack_fffffffffffffd37;
  string *in_stack_fffffffffffffd38;
  undefined7 in_stack_fffffffffffffd40;
  undefined1 in_stack_fffffffffffffd47;
  reference in_stack_fffffffffffffd48;
  UniValue *in_stack_fffffffffffffd50;
  undefined4 in_stack_fffffffffffffd58;
  int in_stack_fffffffffffffd5c;
  string *in_stack_fffffffffffffd60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd68;
  undefined7 in_stack_fffffffffffffdd0;
  undefined1 in_stack_fffffffffffffdd7;
  allocator<char> local_141 [33];
  string local_120 [32];
  string local_100 [32];
  string local_e0 [32];
  string local_c0 [184];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffd50,(char *)in_stack_fffffffffffffd48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd68,(char *)in_stack_fffffffffffffd60,
             (allocator<char> *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
  RunCommandParseJSON(in_RDX,(string *)CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0)
                     );
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffd18);
  std::allocator<char>::~allocator(local_141);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffd18);
  bVar1 = UniValue::isArray(in_stack_fffffffffffffd18);
  if (bVar1) {
    UniValue::getValues(in_stack_fffffffffffffd48);
    std::vector<UniValue,_std::allocator<UniValue>_>::begin
              ((vector<UniValue,_std::allocator<UniValue>_> *)in_stack_fffffffffffffd20);
    std::vector<UniValue,_std::allocator<UniValue>_>::end
              ((vector<UniValue,_std::allocator<UniValue>_> *)in_stack_fffffffffffffd20);
    while (bVar1 = __gnu_cxx::
                   operator==<const_UniValue_*,_std::vector<UniValue,_std::allocator<UniValue>_>_>
                             ((__normal_iterator<const_UniValue_*,_std::vector<UniValue,_std::allocator<UniValue>_>_>
                               *)in_stack_fffffffffffffd28,
                              (__normal_iterator<const_UniValue_*,_std::vector<UniValue,_std::allocator<UniValue>_>_>
                               *)in_stack_fffffffffffffd20), ((bVar1 ^ 0xffU) & 1) != 0) {
      this = __gnu_cxx::
             __normal_iterator<const_UniValue_*,_std::vector<UniValue,_std::allocator<UniValue>_>_>
             ::operator*((__normal_iterator<const_UniValue_*,_std::vector<UniValue,_std::allocator<UniValue>_>_>
                          *)in_stack_fffffffffffffd18);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffd38,
                 (char *)CONCAT17(in_stack_fffffffffffffd37,in_stack_fffffffffffffd30));
      key._M_str = (char *)in_stack_fffffffffffffd68;
      key._M_len = (size_t)in_stack_fffffffffffffd60;
      UniValue::find_value
                ((UniValue *)CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40),key);
      bVar1 = UniValue::isNull(in_stack_fffffffffffffd18);
      if (!bVar1) {
        bVar1 = UniValue::isStr(in_stack_fffffffffffffd18);
        if (bVar1) {
          prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
          UniValue::getValStr_abi_cxx11_(in_stack_fffffffffffffd18);
          tinyformat::format<std::__cxx11::string,std::__cxx11::string>
                    ((char *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffd50,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffd48);
          std::runtime_error::runtime_error(prVar3,local_100);
          if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
            __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
        }
        else {
          prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
          tinyformat::format<std::__cxx11::string>
                    ((char *)in_stack_fffffffffffffd48,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40));
          std::runtime_error::runtime_error(prVar3,local_e0);
          if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
            __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
        }
        goto LAB_019497ca;
      }
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffd38,
                 (char *)CONCAT17(in_stack_fffffffffffffd37,in_stack_fffffffffffffd30));
      key_00._M_str = (char *)in_stack_fffffffffffffd68;
      key_00._M_len = (size_t)in_stack_fffffffffffffd60;
      UniValue::find_value
                ((UniValue *)CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40),key_00);
      bVar1 = UniValue::isNull(in_stack_fffffffffffffd18);
      if (bVar1) {
        prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
        tinyformat::format<std::__cxx11::string>
                  ((char *)in_stack_fffffffffffffd48,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40));
        std::runtime_error::runtime_error(prVar3,local_120);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
          __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        goto LAB_019497ca;
      }
      in_stack_fffffffffffffd60 = UniValue::get_str_abi_cxx11_(in_stack_fffffffffffffd20);
      bVar1 = false;
      std::vector<ExternalSigner,_std::allocator<ExternalSigner>_>::begin
                ((vector<ExternalSigner,_std::allocator<ExternalSigner>_> *)
                 in_stack_fffffffffffffd20);
      std::vector<ExternalSigner,_std::allocator<ExternalSigner>_>::end
                ((vector<ExternalSigner,_std::allocator<ExternalSigner>_> *)
                 in_stack_fffffffffffffd20);
      while (bVar2 = __gnu_cxx::
                     operator==<ExternalSigner_*,_std::vector<ExternalSigner,_std::allocator<ExternalSigner>_>_>
                               ((__normal_iterator<ExternalSigner_*,_std::vector<ExternalSigner,_std::allocator<ExternalSigner>_>_>
                                 *)in_stack_fffffffffffffd28,
                                (__normal_iterator<ExternalSigner_*,_std::vector<ExternalSigner,_std::allocator<ExternalSigner>_>_>
                                 *)in_stack_fffffffffffffd20), ((bVar2 ^ 0xffU) & 1) != 0) {
        __gnu_cxx::
        __normal_iterator<ExternalSigner_*,_std::vector<ExternalSigner,_std::allocator<ExternalSigner>_>_>
        ::operator*((__normal_iterator<ExternalSigner_*,_std::vector<ExternalSigner,_std::allocator<ExternalSigner>_>_>
                     *)in_stack_fffffffffffffd18);
        in_stack_fffffffffffffd5c =
             std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffd48,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40));
        if (in_stack_fffffffffffffd5c == 0) {
          bVar1 = true;
        }
        __gnu_cxx::
        __normal_iterator<ExternalSigner_*,_std::vector<ExternalSigner,_std::allocator<ExternalSigner>_>_>
        ::operator++((__normal_iterator<ExternalSigner_*,_std::vector<ExternalSigner,_std::allocator<ExternalSigner>_>_>
                      *)in_stack_fffffffffffffd18);
      }
      if (bVar1) break;
      std::__cxx11::string::string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffd37,in_stack_fffffffffffffd30));
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffd38,
                 (char *)CONCAT17(in_stack_fffffffffffffd37,in_stack_fffffffffffffd30));
      key_01._M_str = (char *)in_stack_fffffffffffffd68;
      key_01._M_len = (size_t)in_stack_fffffffffffffd60;
      in_stack_fffffffffffffd50 =
           UniValue::find_value
                     ((UniValue *)CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40),
                      key_01);
      in_stack_fffffffffffffd47 = UniValue::isStr(in_stack_fffffffffffffd18);
      if ((bool)in_stack_fffffffffffffd47) {
        in_stack_fffffffffffffd38 = UniValue::getValStr_abi_cxx11_(in_stack_fffffffffffffd18);
        in_stack_fffffffffffffd37 =
             std::operator==(in_stack_fffffffffffffd28,(char *)in_stack_fffffffffffffd20);
        if (((in_stack_fffffffffffffd37 ^ 0xff) & 1) != 0) {
          in_stack_fffffffffffffd28 = UniValue::getValStr_abi_cxx11_(in_stack_fffffffffffffd18);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator+=(in_stack_fffffffffffffd28,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffd20);
        }
      }
      std::vector<ExternalSigner,std::allocator<ExternalSigner>>::
      emplace_back<std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string&>
                ((vector<ExternalSigner,_std::allocator<ExternalSigner>_> *)this,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40),
                 in_stack_fffffffffffffd38,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffd37,in_stack_fffffffffffffd30),
                 in_stack_fffffffffffffd28);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffd18);
      __gnu_cxx::
      __normal_iterator<const_UniValue_*,_std::vector<UniValue,_std::allocator<UniValue>_>_>::
      operator++((__normal_iterator<const_UniValue_*,_std::vector<UniValue,_std::allocator<UniValue>_>_>
                  *)in_stack_fffffffffffffd18);
      in_stack_fffffffffffffd48 = this;
    }
    UniValue::~UniValue(in_stack_fffffffffffffd18);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      return true;
    }
  }
  else {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    tinyformat::format<std::__cxx11::string>
              ((char *)in_stack_fffffffffffffd48,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40));
    std::runtime_error::runtime_error(prVar3,local_c0);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
LAB_019497ca:
  __stack_chk_fail();
}

Assistant:

bool ExternalSigner::Enumerate(const std::string& command, std::vector<ExternalSigner>& signers, const std::string chain)
{
    // Call <command> enumerate
    const UniValue result = RunCommandParseJSON(command + " enumerate");
    if (!result.isArray()) {
        throw std::runtime_error(strprintf("'%s' received invalid response, expected array of signers", command));
    }
    for (const UniValue& signer : result.getValues()) {
        // Check for error
        const UniValue& error = signer.find_value("error");
        if (!error.isNull()) {
            if (!error.isStr()) {
                throw std::runtime_error(strprintf("'%s' error", command));
            }
            throw std::runtime_error(strprintf("'%s' error: %s", command, error.getValStr()));
        }
        // Check if fingerprint is present
        const UniValue& fingerprint = signer.find_value("fingerprint");
        if (fingerprint.isNull()) {
            throw std::runtime_error(strprintf("'%s' received invalid response, missing signer fingerprint", command));
        }
        const std::string& fingerprintStr{fingerprint.get_str()};
        // Skip duplicate signer
        bool duplicate = false;
        for (const ExternalSigner& signer : signers) {
            if (signer.m_fingerprint.compare(fingerprintStr) == 0) duplicate = true;
        }
        if (duplicate) break;
        std::string name;
        const UniValue& model_field = signer.find_value("model");
        if (model_field.isStr() && model_field.getValStr() != "") {
            name += model_field.getValStr();
        }
        signers.emplace_back(command, chain, fingerprintStr, name);
    }
    return true;
}